

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio_json_parser.h
# Opt level: O2

size_t fio_json_parse(json_parser_s *parser,char *buffer,size_t length)

{
  fio_json_stack_s *ary;
  byte *start;
  undefined8 uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  FIOBJ FVar5;
  json_parser_s jVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  fiobj_json_parser_s *pr;
  byte *pbVar10;
  double num;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint8_t *tmp;
  json_parser_s *local_40;
  char *local_38;
  
  if (buffer == (char *)0x0 || length == 0) {
    return 0;
  }
  pbVar7 = (byte *)(buffer + length);
  local_40 = parser + 2;
  ary = (fio_json_stack_s *)(parser + 4);
  local_38 = buffer;
LAB_00150808:
  while ((buffer < pbVar7 && (""[(byte)*buffer] != '\0'))) {
    buffer = (char *)((byte *)buffer + 1);
  }
  pbVar9 = pbVar7;
  if ((byte *)buffer == pbVar7) goto LAB_00150dd0;
  bVar2 = *buffer;
  pbVar9 = (byte *)buffer;
  switch(bVar2) {
  case 0x22:
    start = (byte *)buffer + 1;
    pbVar10 = start;
    do {
      if (pbVar7 <= pbVar10) goto LAB_00150dd0;
      bVar2 = *pbVar10;
      uVar4 = (ulong)bVar2;
      if (""[uVar4] == '\0') {
        pbVar8 = (byte *)(((ulong)pbVar10 & 0xfffffffffffffff8) + 8);
        if (pbVar8 < pbVar7) {
          if (pbVar8 <= pbVar7) {
            for (; pbVar10 < pbVar8; pbVar10 = pbVar10 + 1) {
              bVar2 = *pbVar10;
              uVar4 = (ulong)bVar2;
              if (""[uVar4] != '\0') goto LAB_00150aef;
            }
          }
          for (; pbVar10 < (byte *)((ulong)pbVar7 & 0xfffffffffffffff8); pbVar10 = pbVar10 + 8) {
            uVar1 = *(undefined8 *)pbVar10;
            auVar13._8_4_ = (int)uVar1;
            auVar13._0_8_ = uVar1;
            auVar13._12_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar11 = (auVar13 ^ _DAT_0015f7c0) & _DAT_0015f7d0;
            auVar12._0_8_ = auVar11._0_8_ + 0x101010101010101;
            auVar12._8_8_ = auVar11._8_8_ + 0x101010101010101;
            auVar13 = auVar12 & (auVar13 ^ _DAT_0015f7c0) & _DAT_0015f7f0;
            auVar11._0_4_ = -(uint)(auVar13._0_4_ == 0);
            auVar11._4_4_ = -(uint)(auVar13._4_4_ == 0);
            auVar11._8_4_ = -(uint)(auVar13._8_4_ == 0);
            auVar11._12_4_ = -(uint)(auVar13._12_4_ == 0);
            uVar3 = movmskps((int)uVar4,auVar11);
            uVar4 = (ulong)(uVar3 ^ 0xf);
            if ((uVar3 ^ 0xf) != 0) break;
          }
        }
        pbVar8 = pbVar10;
        if (pbVar10 + 4 <= pbVar7) {
          bVar2 = *pbVar10;
          if (""[bVar2] == '\0') {
            bVar2 = pbVar10[1];
            if (""[bVar2] == '\0') {
              bVar2 = pbVar10[2];
              if (""[bVar2] == '\0') {
                bVar2 = pbVar10[3];
                pbVar8 = pbVar10 + 4;
                if (""[bVar2] == '\0') goto LAB_00150b7f;
                pbVar10 = pbVar10 + 3;
              }
              else {
                pbVar10 = pbVar10 + 2;
              }
            }
            else {
              pbVar10 = pbVar10 + 1;
            }
          }
          goto LAB_00150aef;
        }
LAB_00150b7f:
        while (pbVar10 = pbVar8, pbVar10 < pbVar7) {
          bVar2 = *pbVar10;
          if (""[bVar2] != '\0') goto LAB_00150aef;
          pbVar8 = pbVar10 + 1;
        }
      }
      else {
LAB_00150aef:
        if (bVar2 == 0x22) goto LAB_00150d12;
      }
      pbVar10 = pbVar10 + 2;
    } while( true );
  case 0x23:
switchD_0015084c_caseD_23:
    pbVar8 = (byte *)memchr(buffer,10,(long)pbVar7 - (long)buffer);
    if (pbVar8 == (byte *)0x0) goto LAB_00150dd0;
    break;
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
    goto switchD_0015084c_caseD_24;
  case 0x2d:
  case 0x2e:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x45:
  case 0x49:
    goto switchD_0015084c_caseD_2d;
  case 0x2f:
    if (((byte *)buffer)[1] == 0x2f) goto switchD_0015084c_caseD_23;
    if (((byte *)buffer)[1] != 0x2a) goto switchD_0015084c_caseD_24;
    if (pbVar7 < (byte *)buffer + 4) goto LAB_00150dd0;
    pbVar8 = (byte *)buffer + 3;
    do {
      pbVar8 = (byte *)memchr(pbVar8,0x2f,(long)pbVar7 - (long)pbVar8);
      if (pbVar8 == (byte *)0x0) goto LAB_00150dd0;
    } while (pbVar8[-1] != 0x2a);
    break;
  case 0x4e:
switchD_0015084c_caseD_4e:
    pbVar8 = (byte *)buffer + 2;
    if (((pbVar7 < pbVar8) || ((((byte *)buffer)[1] & 0xdf) != 0x41)) || ((*pbVar8 & 0xdf) != 0x4e))
    {
      if ((byte *)buffer + 3 < pbVar7) {
        if (((((byte *)buffer)[1] != 0x75) || (*pbVar8 != 0x6c)) || (((byte *)buffer)[3] != 0x6c))
        goto switchD_0015084c_caseD_24;
        fio_json_on_null(parser);
LAB_00150a4a:
        pbVar8 = (byte *)buffer + 4;
        goto LAB_00150d86;
      }
    }
    else {
switchD_0015084c_caseD_2d:
      tmp = (uint8_t *)buffer;
      uVar4 = fio_atol((char **)&tmp);
      if (tmp <= pbVar7) {
        if ((tmp == (uint8_t *)0x0) || (""[*tmp] != '\0')) {
          tmp = (uint8_t *)buffer;
          num = fio_atof((char **)&tmp);
          if (pbVar7 < tmp) goto LAB_00150dd0;
          if ((tmp == (uint8_t *)0x0) || (""[*tmp] != '\0')) goto switchD_0015084c_caseD_24;
          FVar5 = fiobj_float_new(num);
        }
        else if ((long)(uVar4 + 0x4000000000000000) < 0) {
          FVar5 = fiobj_num_new_bignum(uVar4);
        }
        else {
          FVar5 = (uVar4 * 2 | uVar4 & 0x8000000000000000) + 1;
        }
        fiobj_json_add2parser((fiobj_json_parser_s *)parser,FVar5);
        pbVar8 = tmp;
        goto LAB_00150d86;
      }
    }
    goto LAB_00150dd0;
  default:
    switch(bVar2) {
    case 0x65:
    case 0x69:
      goto switchD_0015084c_caseD_2d;
    case 0x66:
      if ((byte *)buffer + 4 < pbVar7) {
        if (((((byte *)buffer)[1] != 0x61) || (((byte *)buffer)[2] != 0x6c)) ||
           ((((byte *)buffer)[3] != 0x73 || (((byte *)buffer)[4] != 0x65))))
        goto switchD_0015084c_caseD_24;
        fiobj_json_add2parser((fiobj_json_parser_s *)parser,0x26);
        pbVar8 = (byte *)buffer + 5;
        break;
      }
      goto LAB_00150dd0;
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
      goto switchD_0015084c_caseD_24;
    case 0x6e:
      goto switchD_0015084c_caseD_4e;
    default:
      switch(bVar2) {
      case 0x74:
        if ((byte *)buffer + 3 < pbVar7) {
          if (((((byte *)buffer)[1] != 0x72) || (((byte *)buffer)[2] != 0x75)) ||
             (((byte *)buffer)[3] != 0x65)) goto switchD_0015084c_caseD_24;
          fiobj_json_add2parser((fiobj_json_parser_s *)parser,0x16);
          goto LAB_00150a4a;
        }
        goto LAB_00150dd0;
      case 0x75:
      case 0x76:
      case 0x77:
      case 0x79:
      case 0x7a:
      case 0x7c:
        goto switchD_0015084c_caseD_24;
      case 0x78:
        goto switchD_0015084c_caseD_2d;
      case 0x7b:
        if ((parser->key != '\0') ||
           (bVar2 = parser->depth + 1, parser->depth = bVar2, 0x1f < bVar2))
        goto switchD_0015084c_caseD_24;
        parser->dict = parser->dict * 2 + 1;
        if (parser[3] == (json_parser_s)0x0) {
          jVar6 = (json_parser_s)fiobj_hash_new();
          fiobj_json_add2parser((fiobj_json_parser_s *)parser,(FIOBJ)jVar6);
          fio_json_stack_push(ary,(FIOBJ)parser[2]);
          parser[2] = jVar6;
        }
        else {
          fio_json_stack_push(ary,(FIOBJ)parser[2]);
          parser[2] = parser[3];
          parser[3].dict = 0;
          parser[3].depth = '\0';
          parser[3].key = '\0';
          *(undefined2 *)&parser[3].field_0x6 = 0;
        }
        pbVar8 = (byte *)buffer + 1;
        *(undefined1 *)&parser[8].dict = 1;
        break;
      case 0x7d:
        uVar3 = parser->dict;
        if ((uVar3 & 1) == 0) goto switchD_0015084c_caseD_24;
        if (parser->key == '\0') {
          fio_json_on_null(parser);
          uVar3 = parser->dict;
        }
        parser->depth = parser->depth + 0xff;
        parser->dict = uVar3 >> 1;
        jVar6 = parser[1];
        if (jVar6 != (json_parser_s)0x0) {
          if (2 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR("WARNING: (JSON parsing) malformed JSON, ignoring dangling Hash key.");
            jVar6 = parser[1];
          }
          fiobj_free((FIOBJ)jVar6);
          parser[1].dict = 0;
          parser[1].depth = '\0';
          parser[1].key = '\0';
          *(undefined2 *)&parser[1].field_0x6 = 0;
        }
LAB_00150c3b:
        pbVar8 = (byte *)buffer + 1;
        parser[2].dict = 0;
        parser[2].depth = '\0';
        parser[2].key = '\0';
        *(undefined2 *)&parser[2].field_0x6 = 0;
        fio_json_stack_pop(ary,(FIOBJ *)local_40);
        *(bool *)&parser[8].dict = (parser[2].dict & 7) == 4;
        break;
      default:
        if (bVar2 != 0x5b) {
          if ((bVar2 != 0x5d) || ((parser->dict & 1) != 0)) goto switchD_0015084c_caseD_24;
          parser->depth = parser->depth + 0xff;
          parser->dict = parser->dict >> 1;
          goto LAB_00150c3b;
        }
        if (((parser->key != '\0') ||
            (bVar2 = parser->depth + 1, parser->depth = bVar2, 0x1f < bVar2)) ||
           (parser->dict = parser->dict << 1, parser[3] != (json_parser_s)0x0))
        goto switchD_0015084c_caseD_24;
        pbVar8 = (byte *)buffer + 1;
        jVar6 = (json_parser_s)fiobj_ary_new();
        fiobj_json_add2parser((fiobj_json_parser_s *)parser,(FIOBJ)jVar6);
        fio_json_stack_push(ary,(FIOBJ)parser[2]);
        parser[2] = jVar6;
        *(undefined1 *)&parser[8].dict = 0;
      }
    }
    goto LAB_00150d86;
  }
  pbVar8 = pbVar8 + 1;
  goto LAB_00150d96;
LAB_00150d12:
  if (parser->key != '\0') {
    pbVar8 = pbVar10 + 1;
    do {
      if (pbVar7 <= pbVar8) goto LAB_00150dd0;
      bVar2 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (""[bVar2] != '\0');
    if (bVar2 != 0x3a) {
switchD_0015084c_caseD_24:
      if (parser[5] == parser[4]) {
        FVar5 = 0;
      }
      else {
        FVar5 = *(FIOBJ *)((long)parser[7] + (long)parser[4] * 8);
      }
      fiobj_free(FVar5);
      fiobj_free((FIOBJ)parser[1]);
      fio_json_stack_free(ary);
      *(undefined1 (*) [16])(parser + 6) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(parser + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(parser + 2) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])parser = (undefined1  [16])0x0;
      parser[8].dict = 0;
      parser[8].depth = '\0';
      parser[8].key = '\0';
      *(undefined2 *)&parser[8].field_0x6 = 0;
      return 0;
    }
    fio_json_on_string(parser,start,(long)pbVar10 - (long)start);
    parser->key = '\0';
    goto LAB_00150d96;
  }
  fio_json_on_string(parser,start,(long)pbVar10 - (long)start);
  pbVar8 = pbVar10 + 1;
LAB_00150d86:
  pbVar9 = pbVar8;
  if (parser->depth == '\0') goto LAB_00150dd0;
  parser->key = (byte)parser->dict & 1;
LAB_00150d96:
  pbVar9 = pbVar8;
  buffer = (char *)pbVar8;
  if (pbVar7 <= pbVar8) {
LAB_00150dd0:
    return (long)pbVar9 - (long)local_38;
  }
  goto LAB_00150808;
}

Assistant:

static size_t __attribute__((unused))
fio_json_parse(json_parser_s *parser, const char *buffer, size_t length) {
  if (!length || !buffer)
    return 0;
  uint8_t *pos = (uint8_t *)buffer;
  const uint8_t *limit = pos + length;
  do {
    while (pos < limit && JSON_SEPERATOR[*pos])
      ++pos;
    if (pos == limit)
      goto stop;
    switch (*pos) {
    case '"': {
      uint8_t *tmp = pos + 1;
      if (seek2eos(&tmp, limit) == 0)
        goto stop;
      if (parser->key) {
        uint8_t *key = tmp + 1;
        while (key < limit && JSON_SEPERATOR[*key])
          ++key;
        if (key >= limit)
          goto stop;
        if (*key != ':')
          goto error;
        ++pos;
        fio_json_on_string(parser, pos, (uintptr_t)(tmp - pos));
        pos = key + 1;
        parser->key = 0;
        continue; /* skip tests */
      } else {
        ++pos;
        fio_json_on_string(parser, pos, (uintptr_t)(tmp - pos));
        pos = tmp + 1;
      }
      break;
    }
    case '{':
      if (parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON key can't be a Hash.\n");
#endif
        goto error;
      }
      ++parser->depth;
      if (parser->depth >= JSON_MAX_DEPTH)
        goto error;
      parser->dict = (parser->dict << 1) | 1;
      ++pos;
      if (fio_json_on_start_object(parser))
        goto error;
      break;
    case '}':
      if ((parser->dict & 1) == 0) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON dictionary closure error.\n");
#endif
        goto error;
      }
      if (!parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON dictionary closure missing key value.\n");
        goto error;
#endif
        fio_json_on_null(parser); /* append NULL and recuperate from error. */
      }
      --parser->depth;
      ++pos;
      parser->dict = (parser->dict >> 1);
      fio_json_on_end_object(parser);
      break;
    case '[':
      if (parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON key can't be an array.\n");
#endif
        goto error;
      }
      ++parser->depth;
      if (parser->depth >= JSON_MAX_DEPTH)
        goto error;
      ++pos;
      parser->dict = (parser->dict << 1);
      if (fio_json_on_start_array(parser))
        goto error;
      break;
    case ']':
      if ((parser->dict & 1))
        goto error;
      --parser->depth;
      ++pos;
      parser->dict = (parser->dict >> 1);
      fio_json_on_end_array(parser);
      break;
    case 't':
      if (pos + 3 >= limit)
        goto stop;
      if (pos[1] == 'r' && pos[2] == 'u' && pos[3] == 'e')
        fio_json_on_true(parser);
      else
        goto error;
      pos += 4;
      break;
    case 'N': /* overflow */
    case 'n':
      if (pos + 2 <= limit && (pos[1] | 32) == 'a' && (pos[2] | 32) == 'n')
        goto numeral;
      if (pos + 3 >= limit)
        goto stop;
      if (pos[1] == 'u' && pos[2] == 'l' && pos[3] == 'l')
        fio_json_on_null(parser);
      else
        goto error;
      pos += 4;
      break;
    case 'f':
      if (pos + 4 >= limit)
        goto stop;
      if (pos + 4 < limit && pos[1] == 'a' && pos[2] == 'l' && pos[3] == 's' &&
          pos[4] == 'e')
        fio_json_on_false(parser);
      else
        goto error;
      pos += 5;
      break;
    case '-': /* overflow */
    case '0': /* overflow */
    case '1': /* overflow */
    case '2': /* overflow */
    case '3': /* overflow */
    case '4': /* overflow */
    case '5': /* overflow */
    case '6': /* overflow */
    case '7': /* overflow */
    case '8': /* overflow */
    case '9': /* overflow */
    case '.': /* overflow */
    case 'e': /* overflow */
    case 'E': /* overflow */
    case 'x': /* overflow */
    case 'i': /* overflow */
    case 'I': /* overflow */
    numeral : {
      uint8_t *tmp = pos;
      long long i = fio_atol((char **)&tmp);
      if (tmp > limit)
        goto stop;
      if (!tmp || JSON_NUMERAL[*tmp]) {
        tmp = pos;
        double f = fio_atof((char **)&tmp);
        if (tmp > limit)
          goto stop;
        if (!tmp || JSON_NUMERAL[*tmp])
          goto error;
        fio_json_on_float(parser, f);
        pos = tmp;
      } else {
        fio_json_on_number(parser, i);
        pos = tmp;
      }
      break;
    }
    case '#': /* Ruby style comment */
    {
      uint8_t *tmp = memchr(pos, '\n', (uintptr_t)(limit - pos));
      if (!tmp)
        goto stop;
      pos = tmp + 1;
      continue; /* skip tests */
      ;
    }
    case '/': /* C style / Javascript style comment */
      if (pos[1] == '*') {
        if (pos + 4 > limit)
          goto stop;
        uint8_t *tmp = pos + 3; /* avoid this: /*/
        do {
          tmp = memchr(tmp, '/', (uintptr_t)(limit - tmp));
        } while (tmp && tmp[-1] != '*');
        if (!tmp)
          goto stop;
        pos = tmp + 1;
      } else if (pos[1] == '/') {
        uint8_t *tmp = memchr(pos, '\n', (uintptr_t)(limit - pos));
        if (!tmp)
          goto stop;
        pos = tmp + 1;
      } else
        goto error;
      continue; /* skip tests */
      ;
    default:
      goto error;
    }
    if (parser->depth == 0) {
      fio_json_on_json(parser);
      goto stop;
    }
    parser->key = (parser->dict & 1);
  } while (pos < limit);
stop:
  return (size_t)((uintptr_t)pos - (uintptr_t)buffer);
error:
  fio_json_on_error(parser);
  return 0;
}